

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbcx.h
# Opt level: O0

uint32_t rgbcx::bc1_find_sels4
                   (uint32_t flags,color32 *pSrc_pixels,uint32_t lr,uint32_t lg,uint32_t lb,
                   uint32_t hr,uint32_t hg,uint32_t hb,uint8_t *sels,uint32_t cur_err)

{
  uint in_EDI;
  uint32_t err;
  uint32_t in_stack_00000040;
  uint32_t in_stack_00000048;
  uint32_t in_stack_0000004c;
  undefined4 in_stack_00000054;
  uint32_t in_stack_0000005c;
  uint32_t in_stack_0000006c;
  uint32_t in_stack_00000070;
  undefined4 in_stack_00000074;
  uint32_t in_stack_0000007c;
  uint32_t in_stack_00000080;
  uint32_t in_stack_00000084;
  uint32_t in_stack_00000088;
  uint32_t in_stack_0000008c;
  uint32_t in_stack_00000090;
  undefined4 in_stack_00000094;
  uint32_t in_stack_000000a0;
  uint8_t *in_stack_000000a8;
  uint32_t in_stack_000000b0;
  undefined4 local_24;
  
  if ((in_EDI & 0x80) == 0) {
    if ((in_EDI & 0x100) == 0) {
      local_24 = bc1_find_sels4_check2_err
                           ((color32 *)CONCAT44(in_stack_00000074,in_stack_00000070),
                            in_stack_0000006c,cur_err,sels._4_4_,(uint32_t)sels,in_stack_0000005c,
                            in_stack_00000080,
                            (uint8_t *)CONCAT44(in_stack_0000008c,in_stack_00000088),
                            in_stack_00000090);
    }
    else {
      local_24 = bc1_find_sels4_fullerr
                           ((color32 *)CONCAT44(in_stack_00000054,hg),in_stack_0000004c,
                            in_stack_00000048,flags,in_stack_00000040,pSrc_pixels._4_4_,
                            (uint32_t)sels,(uint8_t *)CONCAT44(in_stack_0000006c,cur_err),
                            in_stack_00000070);
    }
  }
  else {
    local_24 = bc1_find_sels4_fasterr
                         ((color32 *)CONCAT44(in_stack_00000094,in_stack_00000090),in_stack_0000008c
                          ,in_stack_00000088,in_stack_00000084,in_stack_00000080,in_stack_0000007c,
                          in_stack_000000a0,in_stack_000000a8,in_stack_000000b0);
  }
  return local_24;
}

Assistant:

static inline uint32_t bc1_find_sels4(uint32_t flags, const color32* pSrc_pixels, uint32_t lr, uint32_t lg, uint32_t lb, uint32_t hr, uint32_t hg, uint32_t hb, uint8_t sels[16], uint32_t cur_err)
	{
		uint32_t err;

		if (flags & cEncodeBC1UseFasterMSEEval)
			err = bc1_find_sels4_fasterr(pSrc_pixels, lr, lg, lb, hr, hg, hb, sels, cur_err);
		else if (flags & cEncodeBC1UseFullMSEEval)
			err = bc1_find_sels4_fullerr(pSrc_pixels, lr, lg, lb, hr, hg, hb, sels, cur_err);
		else
			err = bc1_find_sels4_check2_err(pSrc_pixels, lr, lg, lb, hr, hg, hb, sels, cur_err);

		return err;
	}